

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O3

void BrotliBuildMetaBlock
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,
               BrotliEncoderParams *params,uint8_t prev_byte,uint8_t prev_byte2,
               Command_conflict *cmds,size_t num_commands,ContextType literal_context_mode,
               MetaBlockSplit *mb)

{
  BrotliDistanceParams *pBVar1;
  uint32_t *puVar2;
  BlockSplit *dist_split;
  uint32_t uVar3;
  undefined1 auVar4 [16];
  uint32_t uVar5;
  int iVar6;
  BrotliDistanceParams *new_params_00;
  ContextType *context_modes;
  HistogramCommand *insert_and_copy_histograms;
  size_t sVar7;
  uint32_t *puVar8;
  HistogramLiteral *pHVar9;
  HistogramDistance *pHVar10;
  byte bVar11;
  long lVar12;
  ulong uVar13;
  uint32_t *puVar14;
  ulong uVar15;
  uint32_t ndirect;
  size_t sVar16;
  BrotliEncoderParams *pBVar17;
  BrotliEncoderParams *pBVar18;
  uint16_t *puVar19;
  uint uVar20;
  ulong uVar21;
  uint32_t uVar22;
  size_t sVar23;
  uint uVar24;
  bool bVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar32;
  HistogramLiteral *local_1a0;
  HistogramDistance *local_190;
  double dist_cost;
  BrotliEncoderParams new_params;
  BrotliEncoderParams orig_params;
  long lVar29;
  
  pBVar17 = params;
  pBVar18 = &orig_params;
  for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
    iVar6 = pBVar17->quality;
    pBVar18->mode = pBVar17->mode;
    pBVar18->quality = iVar6;
    pBVar17 = (BrotliEncoderParams *)&pBVar17->lgwin;
    pBVar18 = (BrotliEncoderParams *)&pBVar18->lgwin;
  }
  pBVar17 = params;
  pBVar18 = &new_params;
  for (lVar12 = 0x10; uVar5 = orig_params.dist.num_direct_distance_codes,
      uVar3 = orig_params.dist.distance_postfix_bits, lVar12 != 0; lVar12 = lVar12 + -1) {
    iVar6 = pBVar17->quality;
    pBVar18->mode = pBVar17->mode;
    pBVar18->quality = iVar6;
    pBVar17 = (BrotliEncoderParams *)&pBVar17->lgwin;
    pBVar18 = (BrotliEncoderParams *)&pBVar18->lgwin;
  }
  new_params_00 = (BrotliDistanceParams *)(ulong)orig_params.dist.num_direct_distance_codes;
  local_190 = (HistogramDistance *)0x547d42aea2879f2e;
  pBVar1 = &params->dist;
  uVar24 = 0;
  bVar26 = true;
  uVar22 = 0;
  do {
    if (uVar24 < 0x10) {
      do {
        ndirect = uVar24 << ((byte)uVar22 & 0x1f);
        BrotliInitDistanceParams(&new_params,uVar22,ndirect);
        if (ndirect == uVar5 && uVar22 == uVar3) {
          bVar26 = false;
        }
        iVar6 = ComputeDistanceCost(cmds,num_commands,(BrotliDistanceParams *)(ulong)uVar3,
                                    new_params_00,(double *)&new_params.dist);
        if ((iVar6 == 0) || ((double)local_190 < dist_cost)) {
          bVar25 = uVar24 == 0;
          uVar24 = uVar24 - 1 >> 1;
          if (bVar25) {
            uVar24 = 0;
          }
          goto LAB_0010a095;
        }
        (params->dist).max_distance = new_params.dist.max_distance;
        pBVar1->distance_postfix_bits = new_params.dist.distance_postfix_bits;
        pBVar1->num_direct_distance_codes = new_params.dist.num_direct_distance_codes;
        (params->dist).alphabet_size = new_params.dist.alphabet_size;
        *(undefined4 *)&(params->dist).field_0xc = new_params.dist._12_4_;
        uVar24 = uVar24 + 1;
        local_190 = (HistogramDistance *)dist_cost;
      } while (uVar24 != 0x10);
      uVar24 = 0x10;
      local_190 = (HistogramDistance *)dist_cost;
    }
    uVar24 = uVar24 - 1 >> 1;
LAB_0010a095:
    uVar22 = uVar22 + 1;
  } while (uVar22 != 4);
  if ((bVar26) &&
     (ComputeDistanceCost(cmds,num_commands,(BrotliDistanceParams *)(ulong)uVar3,new_params_00,
                          (double *)&orig_params.dist), dist_cost < (double)local_190)) {
    (params->dist).max_distance = orig_params.dist.max_distance;
    pBVar1->distance_postfix_bits = orig_params.dist.distance_postfix_bits;
    pBVar1->num_direct_distance_codes = orig_params.dist.num_direct_distance_codes;
    (params->dist).alphabet_size = orig_params.dist.alphabet_size;
    *(undefined4 *)&(params->dist).field_0xc = orig_params.dist._12_4_;
  }
  if (uVar3 == pBVar1->distance_postfix_bits) {
    if ((num_commands != 0) && (uVar5 != (params->dist).num_direct_distance_codes)) {
LAB_0010a13d:
      puVar19 = &cmds->dist_prefix_;
      sVar16 = num_commands;
      do {
        if (((*(uint *)(puVar19 + -5) & 0x1ffffff) != 0) && (0x7f < puVar19[-1])) {
          uVar24 = *puVar19 & 0x3ff;
          if (uVar5 + 0x10 <= uVar24) {
            uVar24 = (uVar24 - uVar5) - 0x10;
            uVar24 = (uVar24 & ~(-1 << ((byte)uVar3 & 0x1f))) + uVar5 + 0x10 +
                     ((((uVar24 >> (uVar3 & 0x1f) & 1) != 0) + 2 << ((byte)(*puVar19 >> 10) & 0x1f))
                      + *(uint32_t *)(puVar19 + -3) + -4 << ((byte)uVar3 & 0x1f));
          }
          uVar15 = (ulong)uVar24;
          uVar21 = (ulong)(params->dist).num_direct_distance_codes;
          uVar13 = uVar21 + 0x10;
          if (uVar15 < uVar13) {
            uVar22 = 0;
          }
          else {
            bVar11 = (byte)pBVar1->distance_postfix_bits;
            uVar21 = ((4L << (bVar11 & 0x3f)) + (uVar15 - uVar21)) - 0x10;
            uVar24 = 0x1f;
            uVar20 = (uint)uVar21;
            if (uVar20 != 0) {
              for (; uVar20 >> uVar24 == 0; uVar24 = uVar24 - 1) {
              }
            }
            uVar24 = (uVar24 ^ 0xffffffe0) + 0x1f;
            bVar26 = (uVar21 >> ((ulong)uVar24 & 0x3f) & 1) != 0;
            iVar6 = uVar24 - pBVar1->distance_postfix_bits;
            uVar15 = (ulong)(((uint)bVar26 + iVar6 * 2 + 0xfffe << (bVar11 & 0x3f)) +
                             (int)uVar13 + (~(-1 << (bVar11 & 0x1f)) & uVar20) | iVar6 * 0x400);
            uVar22 = (uint32_t)
                     (uVar21 - ((ulong)bVar26 + 2 << ((byte)uVar24 & 0x3f)) >> (bVar11 & 0x3f));
          }
          *puVar19 = (ushort)uVar15;
          *(uint32_t *)(puVar19 + -3) = uVar22;
        }
        puVar19 = puVar19 + 8;
        sVar16 = sVar16 - 1;
      } while (sVar16 != 0);
    }
  }
  else if (num_commands != 0) goto LAB_0010a13d;
  dist_split = &mb->distance_split;
  BrotliSplitBlock(m,cmds,num_commands,ringbuffer,pos,mask,params,&mb->literal_split,
                   &mb->command_split,dist_split);
  sVar16 = (mb->literal_split).num_types;
  if (params->disable_literal_context_modeling == 0) {
    lVar12 = 0x40;
    if (sVar16 == 0) {
      sVar16 = 0;
      context_modes = (ContextType *)0x0;
    }
    else {
      context_modes = (ContextType *)BrotliAllocate(m,sVar16 << 2);
      auVar4 = _DAT_0016bcd0;
      sVar16 = (mb->literal_split).num_types;
      if (sVar16 == 0) {
        sVar16 = 0;
      }
      else {
        lVar29 = sVar16 - 1;
        auVar27._8_4_ = (int)lVar29;
        auVar27._0_8_ = lVar29;
        auVar27._12_4_ = (int)((ulong)lVar29 >> 0x20);
        uVar13 = 0;
        auVar27 = auVar27 ^ _DAT_0016bcd0;
        auVar28 = _DAT_0016bcb0;
        auVar30 = _DAT_0016bcc0;
        do {
          auVar31 = auVar30 ^ auVar4;
          iVar6 = auVar27._4_4_;
          if ((bool)(~(auVar31._4_4_ == iVar6 && auVar27._0_4_ < auVar31._0_4_ ||
                      iVar6 < auVar31._4_4_) & 1)) {
            context_modes[uVar13] = literal_context_mode;
          }
          if ((auVar31._12_4_ != auVar27._12_4_ || auVar31._8_4_ <= auVar27._8_4_) &&
              auVar31._12_4_ <= auVar27._12_4_) {
            context_modes[uVar13 + 1] = literal_context_mode;
          }
          auVar31 = auVar28 ^ auVar4;
          iVar32 = auVar31._4_4_;
          if (iVar32 <= iVar6 && (iVar32 != iVar6 || auVar31._0_4_ <= auVar27._0_4_)) {
            context_modes[uVar13 + 2] = literal_context_mode;
            context_modes[uVar13 + 3] = literal_context_mode;
          }
          uVar13 = uVar13 + 4;
          lVar29 = auVar30._8_8_;
          auVar30._0_8_ = auVar30._0_8_ + 4;
          auVar30._8_8_ = lVar29 + 4;
          lVar29 = auVar28._8_8_;
          auVar28._0_8_ = auVar28._0_8_ + 4;
          auVar28._8_8_ = lVar29 + 4;
        } while ((sVar16 + 3 & 0xfffffffffffffffc) != uVar13);
      }
    }
  }
  else {
    context_modes = (ContextType *)0x0;
    lVar12 = 1;
  }
  sVar16 = sVar16 * lVar12;
  if (sVar16 == 0) {
    local_1a0 = (HistogramLiteral *)0x0;
  }
  else {
    local_1a0 = (HistogramLiteral *)BrotliAllocate(m,sVar16 * 0x410);
    sVar23 = sVar16;
    pHVar9 = local_1a0;
    do {
      memset(pHVar9,0,0x408);
      pHVar9->bit_cost_ = INFINITY;
      pHVar9 = pHVar9 + 1;
      sVar23 = sVar23 - 1;
    } while (sVar23 != 0);
  }
  lVar12 = dist_split->num_types * 4;
  if (lVar12 == 0) {
    local_190 = (HistogramDistance *)0x0;
  }
  else {
    local_190 = (HistogramDistance *)BrotliAllocate(m,dist_split->num_types * 0x2240);
    pHVar10 = local_190;
    do {
      memset(pHVar10,0,0x888);
      pHVar10->bit_cost_ = INFINITY;
      pHVar10 = pHVar10 + 1;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  sVar23 = (mb->command_split).num_types;
  mb->command_histograms_size = sVar23;
  if (sVar23 == 0) {
    mb->command_histograms = (HistogramCommand *)0x0;
    insert_and_copy_histograms = (HistogramCommand *)0x0;
  }
  else {
    insert_and_copy_histograms = (HistogramCommand *)BrotliAllocate(m,sVar23 * 0xb10);
    sVar23 = mb->command_histograms_size;
    mb->command_histograms = insert_and_copy_histograms;
    if (sVar23 != 0) {
      do {
        memset(insert_and_copy_histograms,0,0xb08);
        insert_and_copy_histograms->bit_cost_ = INFINITY;
        insert_and_copy_histograms = insert_and_copy_histograms + 1;
        sVar23 = sVar23 - 1;
      } while (sVar23 != 0);
      insert_and_copy_histograms = mb->command_histograms;
    }
  }
  BrotliBuildHistogramsWithContext
            (cmds,num_commands,&mb->literal_split,&mb->command_split,dist_split,ringbuffer,pos,mask,
             prev_byte,prev_byte2,context_modes,local_1a0,insert_and_copy_histograms,local_190);
  BrotliFree(m,context_modes);
  sVar23 = (mb->literal_split).num_types;
  sVar7 = sVar23 << 6;
  mb->literal_context_map_size = sVar7;
  if (sVar7 == 0) {
    puVar8 = (uint32_t *)0x0;
    mb->literal_context_map = (uint32_t *)0x0;
    mb->literal_histograms_size = 0;
LAB_0010a5ef:
    pHVar9 = (HistogramLiteral *)0x0;
  }
  else {
    puVar8 = (uint32_t *)BrotliAllocate(m,sVar23 << 8);
    sVar23 = mb->literal_context_map_size;
    mb->literal_context_map = puVar8;
    mb->literal_histograms_size = sVar23;
    if (sVar23 == 0) goto LAB_0010a5ef;
    pHVar9 = (HistogramLiteral *)BrotliAllocate(m,sVar23 * 0x410);
    puVar8 = mb->literal_context_map;
  }
  mb->literal_histograms = pHVar9;
  BrotliClusterHistogramsLiteral
            (m,local_1a0,sVar16,0x100,pHVar9,&mb->literal_histograms_size,puVar8);
  BrotliFree(m,local_1a0);
  if ((params->disable_literal_context_modeling != 0) &&
     (sVar16 = (mb->literal_split).num_types, sVar16 != 0)) {
    puVar8 = mb->literal_context_map;
    puVar14 = puVar8 + sVar16 * 0x40;
    do {
      uVar3 = puVar8[sVar16 - 1];
      sVar16 = sVar16 - 1;
      lVar12 = -0x40;
      do {
        puVar2 = puVar14 + lVar12;
        *puVar2 = uVar3;
        puVar2[1] = uVar3;
        puVar2[2] = uVar3;
        puVar2[3] = uVar3;
        lVar12 = lVar12 + 4;
      } while (lVar12 != 0);
      puVar14 = puVar14 + -0x40;
    } while (sVar16 != 0);
  }
  sVar23 = (mb->distance_split).num_types;
  sVar16 = sVar23 * 4;
  mb->distance_context_map_size = sVar16;
  if (sVar16 == 0) {
    puVar8 = (uint32_t *)0x0;
    mb->distance_context_map = (uint32_t *)0x0;
    mb->distance_histograms_size = 0;
  }
  else {
    puVar8 = (uint32_t *)BrotliAllocate(m,sVar23 << 4);
    sVar16 = mb->distance_context_map_size;
    mb->distance_context_map = puVar8;
    mb->distance_histograms_size = sVar16;
    if (sVar16 != 0) {
      pHVar10 = (HistogramDistance *)BrotliAllocate(m,sVar16 * 0x890);
      puVar8 = mb->distance_context_map;
      sVar16 = mb->distance_context_map_size;
      goto LAB_0010a704;
    }
  }
  sVar16 = 0;
  pHVar10 = (HistogramDistance *)0x0;
LAB_0010a704:
  mb->distance_histograms = pHVar10;
  BrotliClusterHistogramsDistance
            (m,local_190,sVar16,0x100,pHVar10,&mb->distance_histograms_size,puVar8);
  BrotliFree(m,local_190);
  return;
}

Assistant:

void BrotliBuildMetaBlock(MemoryManager* m,
                          const uint8_t* ringbuffer,
                          const size_t pos,
                          const size_t mask,
                          BrotliEncoderParams* params,
                          uint8_t prev_byte,
                          uint8_t prev_byte2,
                          Command* cmds,
                          size_t num_commands,
                          ContextType literal_context_mode,
                          MetaBlockSplit* mb) {
  /* Histogram ids need to fit in one byte. */
  static const size_t kMaxNumberOfHistograms = 256;
  HistogramDistance* distance_histograms;
  HistogramLiteral* literal_histograms;
  ContextType* literal_context_modes = NULL;
  size_t literal_histograms_size;
  size_t distance_histograms_size;
  size_t i;
  size_t literal_context_multiplier = 1;
  uint32_t npostfix;
  uint32_t ndirect_msb = 0;
  BROTLI_BOOL check_orig = BROTLI_TRUE;
  double best_dist_cost = 1e99;
  BrotliEncoderParams orig_params = *params;
  BrotliEncoderParams new_params = *params;

  for (npostfix = 0; npostfix <= BROTLI_MAX_NPOSTFIX; npostfix++) {
    for (; ndirect_msb < 16; ndirect_msb++) {
      uint32_t ndirect = ndirect_msb << npostfix;
      BROTLI_BOOL skip;
      double dist_cost;
      BrotliInitDistanceParams(&new_params, npostfix, ndirect);
      if (npostfix == orig_params.dist.distance_postfix_bits &&
          ndirect == orig_params.dist.num_direct_distance_codes) {
        check_orig = BROTLI_FALSE;
      }
      skip = !ComputeDistanceCost(
          cmds, num_commands,
          &orig_params.dist, &new_params.dist, &dist_cost);
      if (skip || (dist_cost > best_dist_cost)) {
        break;
      }
      best_dist_cost = dist_cost;
      params->dist = new_params.dist;
    }
    if (ndirect_msb > 0) ndirect_msb--;
    ndirect_msb /= 2;
  }
  if (check_orig) {
    double dist_cost;
    ComputeDistanceCost(cmds, num_commands,
                        &orig_params.dist, &orig_params.dist, &dist_cost);
    if (dist_cost < best_dist_cost) {
      best_dist_cost = dist_cost;
      params->dist = orig_params.dist;
    }
  }
  RecomputeDistancePrefixes(cmds, num_commands,
                            &orig_params.dist, &params->dist);

  BrotliSplitBlock(m, cmds, num_commands,
                   ringbuffer, pos, mask, params,
                   &mb->literal_split,
                   &mb->command_split,
                   &mb->distance_split);
  if (BROTLI_IS_OOM(m)) return;

  if (!params->disable_literal_context_modeling) {
    literal_context_multiplier = 1 << BROTLI_LITERAL_CONTEXT_BITS;
    literal_context_modes =
        BROTLI_ALLOC(m, ContextType, mb->literal_split.num_types);
    if (BROTLI_IS_OOM(m)) return;
    for (i = 0; i < mb->literal_split.num_types; ++i) {
      literal_context_modes[i] = literal_context_mode;
    }
  }

  literal_histograms_size =
      mb->literal_split.num_types * literal_context_multiplier;
  literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, literal_histograms_size);
  if (BROTLI_IS_OOM(m)) return;
  ClearHistogramsLiteral(literal_histograms, literal_histograms_size);

  distance_histograms_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, distance_histograms_size);
  if (BROTLI_IS_OOM(m)) return;
  ClearHistogramsDistance(distance_histograms, distance_histograms_size);

  BROTLI_DCHECK(mb->command_histograms == 0);
  mb->command_histograms_size = mb->command_split.num_types;
  mb->command_histograms =
      BROTLI_ALLOC(m, HistogramCommand, mb->command_histograms_size);
  if (BROTLI_IS_OOM(m)) return;
  ClearHistogramsCommand(mb->command_histograms, mb->command_histograms_size);

  BrotliBuildHistogramsWithContext(cmds, num_commands,
      &mb->literal_split, &mb->command_split, &mb->distance_split,
      ringbuffer, pos, mask, prev_byte, prev_byte2, literal_context_modes,
      literal_histograms, mb->command_histograms, distance_histograms);
  BROTLI_FREE(m, literal_context_modes);

  BROTLI_DCHECK(mb->literal_context_map == 0);
  mb->literal_context_map_size =
      mb->literal_split.num_types << BROTLI_LITERAL_CONTEXT_BITS;
  mb->literal_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->literal_context_map_size);
  if (BROTLI_IS_OOM(m)) return;

  BROTLI_DCHECK(mb->literal_histograms == 0);
  mb->literal_histograms_size = mb->literal_context_map_size;
  mb->literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, mb->literal_histograms_size);
  if (BROTLI_IS_OOM(m)) return;

  BrotliClusterHistogramsLiteral(m, literal_histograms, literal_histograms_size,
      kMaxNumberOfHistograms, mb->literal_histograms,
      &mb->literal_histograms_size, mb->literal_context_map);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, literal_histograms);

  if (params->disable_literal_context_modeling) {
    /* Distribute assignment to all contexts. */
    for (i = mb->literal_split.num_types; i != 0;) {
      size_t j = 0;
      i--;
      for (; j < (1 << BROTLI_LITERAL_CONTEXT_BITS); j++) {
        mb->literal_context_map[(i << BROTLI_LITERAL_CONTEXT_BITS) + j] =
            mb->literal_context_map[i];
      }
    }
  }

  BROTLI_DCHECK(mb->distance_context_map == 0);
  mb->distance_context_map_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  mb->distance_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->distance_context_map_size);
  if (BROTLI_IS_OOM(m)) return;

  BROTLI_DCHECK(mb->distance_histograms == 0);
  mb->distance_histograms_size = mb->distance_context_map_size;
  mb->distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, mb->distance_histograms_size);
  if (BROTLI_IS_OOM(m)) return;

  BrotliClusterHistogramsDistance(m, distance_histograms,
                                  mb->distance_context_map_size,
                                  kMaxNumberOfHistograms,
                                  mb->distance_histograms,
                                  &mb->distance_histograms_size,
                                  mb->distance_context_map);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, distance_histograms);
}